

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImStb::stb_text_makeundo_replace
               (ImGuiInputTextState *str,STB_TexteditState *state,int where,int old_length,
               int new_length)

{
  ImWchar IVar1;
  ImWchar *pIVar2;
  int in_ECX;
  undefined4 in_EDX;
  int in_R8D;
  ImWchar *p;
  int i;
  undefined8 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  int iVar3;
  
  pIVar2 = stb_text_createundo((StbUndoState *)CONCAT44(in_EDX,in_ECX),in_R8D,
                               in_stack_ffffffffffffffe0,
                               (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  if (pIVar2 != (ImWchar *)0x0) {
    for (iVar3 = 0; iVar3 < in_ECX; iVar3 = iVar3 + 1) {
      IVar1 = STB_TEXTEDIT_GETCHAR
                        ((ImGuiInputTextState *)CONCAT44(in_R8D,iVar3),(int)((ulong)pIVar2 >> 0x20))
      ;
      pIVar2[iVar3] = IVar1;
    }
  }
  return;
}

Assistant:

static void stb_text_makeundo_replace(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, int where, int old_length, int new_length)
{
   int i;
   STB_TEXTEDIT_CHARTYPE *p = stb_text_createundo(&state->undostate, where, old_length, new_length);
   if (p) {
      for (i=0; i < old_length; ++i)
         p[i] = STB_TEXTEDIT_GETCHAR(str, where+i);
   }
}